

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parson.c
# Opt level: O1

JSON_Status json_object_set_value(JSON_Object *object,char *name,JSON_Value *value)

{
  size_t sVar1;
  JSON_Status JVar2;
  size_t sVar3;
  char *__dest;
  size_t sVar4;
  unsigned_long hash;
  parson_bool_t found;
  parson_bool_t local_44;
  size_t local_40;
  size_t local_38;
  
  local_44 = 0;
  JVar2 = -1;
  if ((value != (JSON_Value *)0x0 && (name != (char *)0x0 && object != (JSON_Object *)0x0)) &&
     (value->parent == (JSON_Value *)0x0)) {
    sVar3 = strlen(name);
    if (sVar3 == 0) {
      hash = 0x1505;
    }
    else {
      hash = 0x1505;
      sVar4 = 0;
      do {
        if ((ulong)(byte)name[sVar4] == 0) break;
        hash = hash * 0x21 + (ulong)(byte)name[sVar4];
        sVar4 = sVar4 + 1;
      } while (sVar3 != sVar4);
    }
    local_44 = 0;
    local_40 = json_object_get_cell_ix(object,name,sVar3,hash,&local_44);
    if (local_44 == 0) {
      if (object->item_capacity <= object->count) {
        JVar2 = json_object_grow_and_rehash(object);
        if (JVar2 != 0) {
          return -1;
        }
        sVar3 = strlen(name);
        local_40 = json_object_get_cell_ix(object,name,sVar3,hash,&local_44);
      }
      local_38 = strlen(name);
      __dest = (char *)(*parson_malloc)(local_38 + 1);
      if (__dest == (char *)0x0) {
        __dest = (char *)0x0;
      }
      else {
        __dest[local_38] = '\0';
        memcpy(__dest,name,local_38);
      }
      if (__dest == (char *)0x0) {
        return -1;
      }
      sVar1 = object->count;
      object->names[sVar1] = __dest;
      object->cells[local_40] = sVar1;
      sVar1 = object->count;
      object->values[sVar1] = value;
      object->cell_ixs[sVar1] = local_40;
      object->hashes[object->count] = hash;
      object->count = object->count + 1;
    }
    else {
      sVar1 = object->cells[local_40];
      json_value_free(object->values[sVar1]);
      object->values[sVar1] = value;
    }
    value->parent = object->wrapping_value;
    JVar2 = 0;
  }
  return JVar2;
}

Assistant:

JSON_Status json_object_set_value(JSON_Object *object, const char *name, JSON_Value *value) {
    unsigned long hash = 0;
    parson_bool_t found = PARSON_FALSE;
    size_t cell_ix = 0;
    size_t item_ix = 0;
    JSON_Value *old_value = NULL;
    char *key_copy = NULL;

    if (!object || !name || !value || value->parent) {
        return JSONFailure;
    }
    hash = hash_string(name, strlen(name));
    found = PARSON_FALSE;
    cell_ix = json_object_get_cell_ix(object, name, strlen(name), hash, &found);
    if (found) {
        item_ix = object->cells[cell_ix];
        old_value = object->values[item_ix];
        json_value_free(old_value);
        object->values[item_ix] = value;
        value->parent = json_object_get_wrapping_value(object);
        return JSONSuccess;
    }
    if (object->count >= object->item_capacity) {
        JSON_Status res = json_object_grow_and_rehash(object);
        if (res != JSONSuccess) {
            return JSONFailure;
        }
        cell_ix = json_object_get_cell_ix(object, name, strlen(name), hash, &found);
    }
    key_copy = parson_strdup(name);
    if (!key_copy) {
        return JSONFailure;
    }
    object->names[object->count] = key_copy;
    object->cells[cell_ix] = object->count;
    object->values[object->count] = value;
    object->cell_ixs[object->count] = cell_ix;
    object->hashes[object->count] = hash;
    object->count++;
    value->parent = json_object_get_wrapping_value(object);
    return JSONSuccess;
}